

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

void __thiscall embree::TokenStream::skipSeparators(TokenStream *this)

{
  int *piVar1;
  uint *puVar2;
  long in_RDI;
  Stream<int> *in_stack_00000038;
  undefined1 local_3a;
  undefined1 local_39;
  
  while( true ) {
    piVar1 = Stream<int>::peek(in_stack_00000038);
    local_39 = 0;
    if (*piVar1 != -1) {
      puVar2 = (uint *)Stream<int>::peek(in_stack_00000038);
      local_3a = 0;
      if (*puVar2 < 0x100) {
        local_3a = *(byte *)(in_RDI + 0x48 + (ulong)*puVar2);
      }
      local_39 = local_3a;
    }
    if ((local_39 & 1) == 0) break;
    Stream<int>::drop(in_stack_00000038);
  }
  return;
}

Assistant:

void TokenStream::skipSeparators()
  {
    /* skip separators */
    while (cin->peek() != EOF && isSeparator(cin->peek()))
      cin->drop();
  }